

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O1

boolean rloc(level *lev,monst *mtmp,boolean suppress_impossible)

{
  boolean bVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  long lVar5;
  uint y1;
  int x;
  uint uVar6;
  uint uVar7;
  
  if (u.usteed == mtmp) {
    tele((char *)0x0);
LAB_0025a53b:
    bVar1 = '\x01';
  }
  else {
    if (((mtmp->field_0x63 & 0x20) != 0) && (mtmp->mx != '\0')) {
      bVar1 = In_W_tower(lev,(int)u.ux,(int)u.uy);
      if (bVar1 == '\0') {
        cVar2 = (lev->upstair).sx;
        lVar5 = 0xfeb1;
      }
      else {
        cVar2 = (lev->dnladder).sx;
        lVar5 = 0xfec0;
        if (cVar2 == '\0') {
          cVar2 = (lev->upladder).sx;
          lVar5 = 0xfebb;
        }
      }
      uVar6 = (uint)lev->levname[lVar5];
      x = (int)cVar2;
      bVar1 = goodpos(lev,x,uVar6,mtmp,0);
      if (bVar1 != '\0') {
LAB_0025a52a:
        rloc_to(mtmp,lev,x,uVar6);
        goto LAB_0025a53b;
      }
    }
    uVar7 = 0;
    do {
      uVar6 = mt_random();
      x = uVar6 % 0x4d + 2;
      uVar6 = mt_random();
      uVar6 = uVar6 % 0x15;
      bVar3 = goodpos(lev,x,uVar6,mtmp,0);
      if (uVar7 < 500) {
        if (bVar3 == 0) {
LAB_0025a729:
          bVar3 = 0;
        }
        else {
          bVar3 = mtmp->my;
          y1 = (uint)(char)bVar3;
          if (mtmp->mx == '\0') {
            if (((lev->dndest).nlx == '\0') || (bVar1 = On_W_tower_level(&u.uz), bVar1 == '\0')) {
              cVar2 = (lev->updest).lx;
              if ((y1 & 1) == 0 || cVar2 == '\0') {
                cVar2 = (lev->dndest).lx;
                if (cVar2 == '\0' || (bVar3 & 1) != 0) goto LAB_0025a5ed;
                if (((x < cVar2) || ((lev->dndest).hx < x)) ||
                   (((int)uVar6 < (int)(lev->dndest).ly || ((int)(lev->dndest).hy < (int)uVar6))))
                goto LAB_0025a729;
                cVar2 = (lev->dndest).nlx;
                bVar3 = 1;
                if (((cVar2 <= x && cVar2 != '\0') && (x <= (lev->dndest).nhx)) &&
                   ((int)(lev->dndest).nly <= (int)uVar6)) {
                  cVar2 = (lev->dndest).nhy;
                  goto LAB_0025a783;
                }
              }
              else {
                if ((((x < cVar2) || ((lev->updest).hx < x)) || ((int)uVar6 < (int)(lev->updest).ly)
                    ) || ((int)(lev->updest).hy < (int)uVar6)) goto LAB_0025a729;
                cVar2 = (lev->updest).nlx;
                bVar3 = 1;
                if (((cVar2 <= x && cVar2 != '\0') && (x <= (lev->updest).nhx)) &&
                   ((int)(lev->updest).nly <= (int)uVar6)) {
                  cVar2 = (lev->updest).nhy;
LAB_0025a783:
                  bVar3 = (int)cVar2 < (int)uVar6;
                }
              }
            }
            else {
              bVar4 = true;
              if ((((lev->dndest).nlx <= x) && (x <= (lev->dndest).nhx)) &&
                 ((int)(lev->dndest).nly <= (int)uVar6)) {
                bVar4 = (int)(lev->dndest).nhy < (int)uVar6;
              }
              bVar3 = (byte)(y1 >> 1) & 1 ^ bVar4;
            }
          }
          else {
            bVar1 = tele_jump_ok(lev,(int)mtmp->mx,y1,x,uVar6);
            if (bVar1 == '\0') goto LAB_0025a729;
LAB_0025a5ed:
            bVar3 = 1;
          }
        }
      }
      if (bVar3 != 0) goto LAB_0025a52a;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 1000);
    x = 2;
    do {
      uVar6 = 0;
      do {
        bVar1 = goodpos(lev,x,uVar6,mtmp,0);
        if (bVar1 != '\0') goto LAB_0025a52a;
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x15);
      x = x + 1;
    } while (x != 0x4f);
    if (suppress_impossible == '\0') {
      bVar1 = '\0';
      warning("rloc(): couldn\'t relocate monster");
    }
    else {
      bVar1 = '\0';
    }
  }
  return bVar1;
}

Assistant:

boolean rloc(struct level *lev,
	     struct monst *mtmp, /* mx==0 implies migrating monster arrival */
	     boolean suppress_impossible)
{
	int x, y, trycount;

	if (mtmp == u.usteed) {
	    tele(NULL);
	    return TRUE;
	}

	if (mtmp->iswiz && mtmp->mx) {	/* Wizard, not just arriving */
	    if (!In_W_tower(lev, u.ux, u.uy))
		x = lev->upstair.sx,  y = lev->upstair.sy;
	    else if (!lev->dnladder.sx)	/* bottom level of tower */
		x = lev->upladder.sx,  y = lev->upladder.sy;
	    else
		x = lev->dnladder.sx,  y = lev->dnladder.sy;
	    /* if the wiz teleports away to heal, try the up staircase,
	       to block the player's escaping before he's healed
	       (deliberately use `goodpos' rather than `rloc_pos_ok' here) */
	    if (goodpos(lev, x, y, mtmp, 0))
		goto found_xy;
	}

	trycount = 0;
	do {
	    x = rn1(COLNO-3,2);
	    y = rn2(ROWNO);
	    if ((trycount < 500) ? rloc_pos_ok(lev, x, y, mtmp)
				 : goodpos(lev, x, y, mtmp, 0))
		goto found_xy;
	} while (++trycount < 1000);

	/* last ditch attempt to find a good place */
	for (x = 2; x < COLNO - 1; x++)
	    for (y = 0; y < ROWNO; y++)
		if (goodpos(lev, x, y, mtmp, 0))
		    goto found_xy;

	/* level either full of monsters or somehow faulty */
	if (!suppress_impossible)
	    warning("rloc(): couldn't relocate monster");
	return FALSE;

 found_xy:
	rloc_to(mtmp, lev, x, y);
	return TRUE;
}